

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall kj::str<kj::OwnFd&>(String *__return_storage_ptr__,kj *this,OwnFd *params)

{
  CappedArray<char,_14UL> *params_00;
  _ a_Stack_28 [24];
  
  operator*(a_Stack_28);
  _::concat<kj::CappedArray<char,14ul>>(__return_storage_ptr__,a_Stack_28,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}